

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v8::detail::vformat_to<char8_t>
               (buffer<char8_t> *buf,basic_string_view<char8_t> fmt,
               basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
               args,locale_ref loc)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  args_00;
  basic_string_view<char8_t> str;
  custom_value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  custom;
  bool bVar1;
  size_t sVar2;
  char8_t *pcVar3;
  char8_t *last;
  undefined8 in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffdb2;
  format_handler local_1d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  local_198;
  char8_t *local_190;
  default_arg_formatter<char8_t> local_180;
  error_handler local_159;
  undefined1 auStack_158 [8];
  format_arg arg;
  buffer_appender<char8_t> out;
  buffer<char8_t> *buf_local;
  locale_ref loc_local;
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  args_local;
  basic_string_view<char8_t> fmt_local;
  custom_value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  local_e8;
  basic_string_view<char8_t> local_d8;
  unsigned___int128 *local_c8;
  unsigned___int128 *local_b8;
  __int128 *local_98;
  __int128 *local_88;
  undefined1 *local_68;
  default_arg_formatter<char8_t> *local_60;
  char8_t *local_50;
  char8_t *p_1;
  writer write;
  char8_t *pcStack_38;
  char8_t c;
  char8_t *p;
  char8_t *end;
  char8_t *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  local_18;
  char8_t *local_10;
  
  args_local.desc_ = (unsigned_long_long)args.field_1;
  loc_local.locale_ = (void *)args.desc_;
  fmt_local.data_ = (char8_t *)fmt.size_;
  args_local.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
        )fmt.data_;
  std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::back_insert_iterator
            ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)&arg.field_0x18,buf);
  sVar2 = basic_string_view<char8_t>::size((basic_string_view<char8_t> *)&args_local.field_1);
  if (sVar2 == 2) {
    pcVar3 = basic_string_view<char8_t>::data((basic_string_view<char8_t> *)&args_local.field_1);
    bVar1 = equal2<char8_t>(pcVar3,"{}");
    if (bVar1) {
      basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
      ::get((format_arg *)auStack_158,
            (basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
             *)&loc_local,0);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)auStack_158);
      if (!bVar1) {
        error_handler::on_error(&local_159,"argument not found");
      }
      local_180.out.container = (buffer<char8_t> *)arg._24_8_;
      local_180.args.desc_ = (unsigned_long_long)loc_local.locale_;
      local_180.args.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
            )args_local.desc_;
      local_68 = auStack_158;
      local_180.loc.locale_ = loc.locale_;
      local_60 = &local_180;
      switch(arg.value_.field_0.int128_value._8_4_) {
      case 0:
        break;
      case 1:
        default_arg_formatter<char8_t>::operator()(&local_180,auStack_158._0_4_);
        return;
      case 2:
        default_arg_formatter<char8_t>::operator()(&local_180,auStack_158._0_4_);
        return;
      case 3:
        default_arg_formatter<char8_t>::operator()
                  (&local_180,CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
        return;
      case 4:
        default_arg_formatter<char8_t>::operator()
                  (&local_180,CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
        return;
      case 5:
        value._8_2_ = in_stack_fffffffffffffdb0;
        value._0_8_ = in_stack_fffffffffffffda8;
        value._10_6_ = in_stack_fffffffffffffdb2;
        local_98 = convert_for_visit<__int128>
                             ((__int128 *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_),
                              (__int128)value);
        value_00._8_2_ = in_stack_fffffffffffffdb0;
        value_00._0_8_ = in_stack_fffffffffffffda8;
        value_00._10_6_ = in_stack_fffffffffffffdb2;
        local_88 = local_98;
        default_arg_formatter<char8_t>::operator()(&local_180,(__int128)value_00);
        return;
      case 6:
        value_01._8_2_ = in_stack_fffffffffffffdb0;
        value_01._0_8_ = in_stack_fffffffffffffda8;
        value_01._10_6_ = in_stack_fffffffffffffdb2;
        local_c8 = convert_for_visit<unsigned__int128>
                             ((unsigned___int128 *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_),
                              (detail *)
                              CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                                       arg.value_.field_0.int_value._0_2_),
                              (unsigned___int128)value_01);
        value_02._8_2_ = in_stack_fffffffffffffdb0;
        value_02._0_8_ = in_stack_fffffffffffffda8;
        value_02._10_6_ = in_stack_fffffffffffffdb2;
        local_b8 = local_c8;
        default_arg_formatter<char8_t>::operator()(&local_180,(unsigned___int128)value_02);
        return;
      case 7:
        default_arg_formatter<char8_t>::operator()(&local_180,(bool)(auStack_158[0] & 1));
        return;
      case 8:
        default_arg_formatter<char8_t>::operator()(&local_180,auStack_158[0]);
        return;
      case 9:
        default_arg_formatter<char8_t>::operator()(&local_180,(float)auStack_158._0_4_);
        return;
      case 10:
        default_arg_formatter<char8_t>::operator()
                  (&local_180,(double)CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
        return;
      case 0xb:
        default_arg_formatter<char8_t>::operator()
                  (&local_180,
                   (longdouble)
                   CONCAT28(arg.value_.field_0.int_value._0_2_,
                            CONCAT44(auStack_158._4_4_,auStack_158._0_4_)));
        return;
      case 0xc:
        default_arg_formatter<char8_t>::operator()
                  (&local_180,(char8_t *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
        return;
      case 0xd:
        basic_string_view<char8_t>::basic_string_view
                  (&local_d8,(char8_t *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_),
                   CONCAT62(arg.value_.field_0.long_long_value._2_6_,
                            arg.value_.field_0.int_value._0_2_));
        default_arg_formatter<char8_t>::operator()(&local_180,local_d8);
        return;
      case 0xe:
        default_arg_formatter<char8_t>::operator()
                  (&local_180,(void *)CONCAT44(auStack_158._4_4_,auStack_158._0_4_));
        return;
      case 0xf:
        custom.value._4_4_ = auStack_158._4_4_;
        custom.value._0_4_ = auStack_158._0_4_;
        custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
        custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
        basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
        ::handle::handle((handle *)&local_e8,custom);
        default_arg_formatter<char8_t>::operator()(&local_180,(handle)local_e8);
        return;
      }
      monostate::monostate((monostate *)((long)&fmt_local.size_ + 7));
      default_arg_formatter<char8_t>::operator()(&local_180);
      return;
    }
  }
  local_198 = args_local.field_1;
  local_190 = fmt_local.data_;
  str.size_ = (size_t)fmt_local.data_;
  str.data_ = (char8_t *)args_local.field_1.values_;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
        )args_local.desc_;
  args_00.desc_ = (unsigned_long_long)loc_local.locale_;
  vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8
  ::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::
  type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::
  detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::
  type>>,fmt::v8::detail::locale_ref)::format_handler::format_handler(std::back_insert_iterator<fmt
  ::v8::detail::buffer<char8_t>>,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt
  ::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::
  buffer<char8_t>>,char8_t>>,fmt::v8::detail::locale_ref_
            (&local_1d8,(buffer_appender<char8_t>)arg._24_8_,str,args_00,loc);
  local_18 = local_198;
  local_10 = local_190;
  end = basic_string_view<char8_t>::data((basic_string_view<char8_t> *)&local_18);
  sVar2 = basic_string_view<char8_t>::size((basic_string_view<char8_t> *)&local_18);
  last = end + sVar2;
  p_1 = (char8_t *)&local_1d8;
  pcVar3 = end;
  if ((long)last - (long)end < 0x20) {
    while (pcStack_38 = pcVar3, pcStack_38 != last) {
      pcVar3 = pcStack_38 + 1;
      write.handler_._7_1_ = *pcStack_38;
      if (write.handler_._7_1_ == '{') {
        vformat_to<char8_t>::format_handler::on_text(&local_1d8,end,pcStack_38);
        end = parse_replacement_field<char8_t,fmt::v8::detail::vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                        (pcStack_38,last,&local_1d8);
        pcVar3 = end;
      }
      else if (write.handler_._7_1_ == '}') {
        if ((pcVar3 == last) || (*pcVar3 != '}')) {
          error_handler::on_error((error_handler *)&local_1d8,"unmatched \'}\' in format string");
          return;
        }
        vformat_to<char8_t>::format_handler::on_text(&local_1d8,end,pcVar3);
        end = pcStack_38 + 2;
        pcVar3 = end;
      }
    }
    vformat_to<char8_t>::format_handler::on_text(&local_1d8,end,last);
  }
  else {
    while (end != last) {
      local_50 = end;
      if ((*end != '{') &&
         (bVar1 = find<false,char8_t,char8_t_const*>(end + 1,last,'{',&local_50), !bVar1)) {
        parse_format_string<false,_char8_t,_format_handler>::writer::operator()
                  ((writer *)&p_1,end,last);
        return;
      }
      parse_format_string<false,_char8_t,_format_handler>::writer::operator()
                ((writer *)&p_1,end,local_50);
      end = parse_replacement_field<char8_t,fmt::v8::detail::vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                      (local_50,last,&local_1d8);
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}